

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreTexture.h
# Opt level: O1

void __thiscall
irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>::unlock
          (COpenGLCoreTexture<irr::video::COpenGLDriver> *this)

{
  code *pcVar1;
  byte bVar2;
  u32 layer;
  long lVar3;
  ITexture *texture;
  IImage *pIVar4;
  _func_int *p_Var5;
  void *data;
  
  if (this->LockImage != (IImage *)0x0) {
    if (this->LockReadOnly == false) {
      lVar3 = *(long *)(*(long *)&(this->super_ITexture).field_0x78 + 0xbe8);
      texture = *(ITexture **)(lVar3 + 0x20);
      COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ::STextureCache::set
                ((STextureCache *)(lVar3 + 0x10),0,&this->super_ITexture,EST_ACTIVE_ALWAYS);
      layer = this->LockLayer;
      bVar2 = this->MipLevelStored;
      data = getLockImageData(this,(uint)bVar2);
      uploadTexture(this,false,layer,(uint)bVar2,data);
      COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ::STextureCache::set
                ((STextureCache *)
                 (*(long *)(*(long *)&(this->super_ITexture).field_0x78 + 0xbe8) + 0x10),0,texture,
                 EST_ACTIVE_ALWAYS);
    }
    pIVar4 = this->LockImage;
    p_Var5 = pIVar4->_vptr_IImage[-3];
    pcVar1 = p_Var5 + 4 + (long)&(pIVar4->Size).Width;
    *(int *)pcVar1 = *(int *)pcVar1 + -1;
    if (*(int *)pcVar1 == 0) {
      (**(code **)(*(long *)((long)&pIVar4->_vptr_IImage + (long)p_Var5) + 8))();
    }
    this->LockReadOnly = false;
    this->LockImage = (IImage *)0x0;
    this->LockLayer = 0;
  }
  return;
}

Assistant:

void unlock() override
	{
		if (!LockImage)
			return;

		if (!LockReadOnly) {
			const COpenGLCoreTexture *prevTexture = Driver->getCacheHandler()->getTextureCache().get(0);
			Driver->getCacheHandler()->getTextureCache().set(0, this);

			uploadTexture(false, LockLayer, MipLevelStored, getLockImageData(MipLevelStored));

			Driver->getCacheHandler()->getTextureCache().set(0, prevTexture);
		}

		LockImage->drop();

		LockReadOnly = false;
		LockImage = 0;
		LockLayer = 0;
	}